

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  pointer pfVar18;
  void *pvVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  int iVar31;
  char *pcVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  float *pfVar36;
  char *pcVar37;
  undefined1 auVar38 [16];
  undefined4 uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int remain;
  
  auVar26 = _DAT_001683e0;
  auVar25 = _DAT_001683d0;
  auVar24 = _DAT_00167c40;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    pvVar15 = _kernel->data;
    pvVar16 = _bias->data;
    iVar14 = bottom_blob->w;
    iVar23 = (iVar14 - iVar12) * 2;
    pvVar17 = top_blob->data;
    lVar34 = top_blob->cstep * top_blob->elemsize;
    uVar27 = top_blob->h * top_blob->w;
    pfVar18 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar28 = (ulong)uVar27 - 1;
    auVar38._8_4_ = (int)lVar28;
    auVar38._0_8_ = lVar28;
    auVar38._12_4_ = (int)((ulong)lVar28 >> 0x20);
    pvVar19 = bottom_blob->data;
    sVar20 = bottom_blob->cstep;
    sVar21 = bottom_blob->elemsize;
    lVar28 = (long)pvVar17 + 0xc;
    auVar38 = auVar38 ^ _DAT_00167c40;
    lVar33 = 0;
    do {
      if (pvVar16 == (void *)0x0) {
        uVar39 = 0;
      }
      else {
        uVar39 = *(undefined4 *)((long)pvVar16 + lVar33 * 4);
      }
      fVar7 = pfVar18[lVar33];
      if (0 < (int)uVar27) {
        uVar29 = 0;
        do {
          auVar40._8_4_ = (int)uVar29;
          auVar40._0_8_ = uVar29;
          auVar40._12_4_ = (int)(uVar29 >> 0x20);
          auVar41 = (auVar40 | auVar26) ^ auVar24;
          iVar31 = auVar38._4_4_;
          if ((bool)(~(iVar31 < auVar41._4_4_ ||
                      auVar38._0_4_ < auVar41._0_4_ && auVar41._4_4_ == iVar31) & 1)) {
            *(undefined4 *)(lVar28 + -0xc + uVar29 * 4) = uVar39;
          }
          if (auVar41._12_4_ <= auVar38._12_4_ &&
              (auVar41._8_4_ <= auVar38._8_4_ || auVar41._12_4_ != auVar38._12_4_)) {
            *(undefined4 *)(lVar28 + -8 + uVar29 * 4) = uVar39;
          }
          auVar40 = (auVar40 | auVar25) ^ auVar24;
          iVar35 = auVar40._4_4_;
          if (iVar35 <= iVar31 && (iVar35 != iVar31 || auVar40._0_4_ <= auVar38._0_4_)) {
            *(undefined4 *)(lVar28 + -4 + uVar29 * 4) = uVar39;
            *(undefined4 *)(lVar28 + uVar29 * 4) = uVar39;
          }
          uVar29 = uVar29 + 4;
        } while ((uVar27 + 3 & 0xfffffffc) != uVar29);
      }
      if (0 < iVar13) {
        pfVar36 = (float *)(lVar34 * lVar33 + (long)pvVar17);
        lVar22 = lVar33 * 9;
        pcVar30 = (char *)(sVar20 * sVar21 * lVar33 + (long)pvVar19);
        pcVar32 = pcVar30 + (long)iVar14 * 2;
        pcVar37 = pcVar30 + iVar14;
        iVar31 = 0;
        do {
          iVar35 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar30;
              pcVar1 = pcVar30 + 1;
              pcVar2 = pcVar30 + 2;
              pcVar30 = pcVar30 + 2;
              cVar9 = *pcVar37;
              pcVar3 = pcVar37 + 1;
              pcVar4 = pcVar37 + 2;
              pcVar37 = pcVar37 + 2;
              cVar10 = *pcVar32;
              pcVar5 = pcVar32 + 1;
              pcVar6 = pcVar32 + 2;
              pcVar32 = pcVar32 + 2;
              *pfVar36 = (float)((int)*(char *)((long)pvVar15 + lVar22 + 8) * (int)*pcVar6 +
                                 (int)*(char *)((long)pvVar15 + lVar22 + 7) * (int)*pcVar5 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 6) * (int)cVar10 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 5) * (int)*pcVar4 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 4) * (int)*pcVar3 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 3) * (int)cVar9 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 2) * (int)*pcVar2 +
                                (int)*(char *)((long)pvVar15 + lVar22 + 1) * (int)*pcVar1 +
                                (int)*(char *)((long)pvVar15 + lVar22) * (int)cVar8) * fVar7 +
                         *pfVar36;
              pfVar36 = pfVar36 + 1;
              iVar35 = iVar35 + -1;
            } while (1 < iVar35);
          }
          pcVar30 = pcVar30 + iVar23;
          pcVar37 = pcVar37 + iVar23;
          pcVar32 = pcVar32 + iVar23;
          iVar31 = iVar31 + 1;
        } while (iVar31 != iVar13);
      }
      lVar33 = lVar33 + 1;
      lVar28 = lVar28 + lVar34;
    } while (lVar33 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;
        
        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}